

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O0

int coda_mem_cursor_read_string(coda_cursor *cursor,char *dst,long dst_size)

{
  int iVar1;
  undefined1 local_340 [8];
  coda_cursor sub_cursor;
  coda_mem_data *type;
  long dst_size_local;
  char *dst_local;
  coda_cursor *cursor_local;
  
  sub_cursor.stack[0x1f].bit_offset = (int64_t)cursor->stack[cursor->n + -1].type;
  if (((coda_dynamic_type_struct *)(sub_cursor.stack[0x1f].bit_offset + 0x10))->backend == 3) {
    memcpy(local_340,cursor,0x310);
    iVar1 = coda_cursor_use_base_type_of_special_type((coda_cursor *)local_340);
    if (iVar1 == 0) {
      cursor_local._4_4_ = coda_cursor_read_string((coda_cursor *)local_340,dst,dst_size);
    }
    else {
      cursor_local._4_4_ = -1;
    }
  }
  else {
    if (((coda_dynamic_type_struct *)(sub_cursor.stack[0x1f].bit_offset + 0x10))->backend != 2) {
      __assert_fail("type->tag == tag_mem_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                    ,0x246,"int coda_mem_cursor_read_string(const coda_cursor *, char *, long)");
    }
    cursor_local._4_4_ = coda_ascii_cursor_read_string(cursor,dst,dst_size);
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_mem_cursor_read_string(const coda_cursor *cursor, char *dst, long dst_size)
{
    coda_mem_data *type = (coda_mem_data *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_special)
    {
        coda_cursor sub_cursor = *cursor;

        if (coda_cursor_use_base_type_of_special_type(&sub_cursor) != 0)
        {
            return -1;
        }
        return coda_cursor_read_string(&sub_cursor, dst, dst_size);
    }

    assert(type->tag == tag_mem_data);
    return coda_ascii_cursor_read_string(cursor, dst, dst_size);
}